

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_test.cc
# Opt level: O1

void __thiscall get_proj_subspace_test_lowbd::GetProjSubspaceTest::SetUp(GetProjSubspaceTest *this)

{
  internal iVar1;
  undefined8 *puVar2;
  ParamType *pPVar3;
  uint8_t *puVar4;
  int32_t *piVar5;
  pointer *__ptr;
  SEARCH_METHODS *pSVar6;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  undefined8 *local_20;
  
  pPVar3 = testing::
           WithParamInterface<std::tuple<void_(*const)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_int_*,_int,_int_*,_int,_long_(*)[2],_long_*,_const_sgr_params_type_*)>_>
           ::GetParam();
  this->target_func_ =
       (set_get_proj_subspace)
       (pPVar3->
       super__Tuple_impl<0UL,_void_(*const)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_int_*,_int,_int_*,_int,_long_(*)[2],_long_*,_const_sgr_params_type_*)>
       ).
       super__Head_base<0UL,_void_(*const)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_int_*,_int,_int_*,_int,_long_(*)[2],_long_*,_const_sgr_params_type_*),_false>
       ._M_head_impl;
  puVar4 = (uint8_t *)aom_malloc(0x24000);
  this->src_ = puVar4;
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            (local_28,"src_","nullptr",&this->src_,&local_38._M_head_impl);
  iVar1 = local_28[0];
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20 == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = (SEARCH_METHODS *)*local_20;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/pickrst_test.cc"
               ,399,(char *)pSVar6);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  puVar2 = local_20;
  if (local_20 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_20 != local_20 + 2) {
      operator_delete((undefined8 *)*local_20);
    }
    operator_delete(puVar2);
  }
  if (iVar1 != (internal)0x0) {
    puVar4 = (uint8_t *)aom_malloc(0x24000);
    this->dgd_ = puVar4;
    local_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              (local_28,"dgd_","nullptr",&this->dgd_,&local_38._M_head_impl);
    iVar1 = local_28[0];
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_20 == (undefined8 *)0x0) {
        pSVar6 = "";
      }
      else {
        pSVar6 = (SEARCH_METHODS *)*local_20;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/pickrst_test.cc"
                 ,0x192,(char *)pSVar6);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if (local_38._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
    puVar2 = local_20;
    if (local_20 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_20 != local_20 + 2) {
        operator_delete((undefined8 *)*local_20);
      }
      operator_delete(puVar2);
    }
    if (iVar1 != (internal)0x0) {
      piVar5 = (int32_t *)aom_malloc(0x90000);
      this->flt0_ = piVar5;
      local_38._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::internal::CmpHelperNE<int*,decltype(nullptr)>
                (local_28,"flt0_","nullptr",&this->flt0_,&local_38._M_head_impl);
      iVar1 = local_28[0];
      if (local_28[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        if (local_20 == (undefined8 *)0x0) {
          pSVar6 = "";
        }
        else {
          pSVar6 = (SEARCH_METHODS *)*local_20;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_30,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/pickrst_test.cc"
                   ,0x195,(char *)pSVar6);
        testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_30);
        if (local_38._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_38._M_head_impl + 8))();
        }
      }
      puVar2 = local_20;
      if (local_20 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_20 != local_20 + 2) {
          operator_delete((undefined8 *)*local_20);
        }
        operator_delete(puVar2);
      }
      if (iVar1 != (internal)0x0) {
        piVar5 = (int32_t *)aom_malloc(0x90000);
        this->flt1_ = piVar5;
        local_38._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::internal::CmpHelperNE<int*,decltype(nullptr)>
                  (local_28,"flt1_","nullptr",&this->flt1_,&local_38._M_head_impl);
        if (local_28[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_38);
          if (local_20 == (undefined8 *)0x0) {
            pSVar6 = "";
          }
          else {
            pSVar6 = (SEARCH_METHODS *)*local_20;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/pickrst_test.cc"
                     ,0x198,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          if (local_38._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_38._M_head_impl + 8))();
          }
        }
        if (local_20 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_20 != local_20 + 2) {
            operator_delete((undefined8 *)*local_20);
          }
          operator_delete(local_20);
        }
      }
    }
  }
  return;
}

Assistant:

void SetUp() override {
    target_func_ = GET_PARAM(0);
    src_ = (uint8_t *)(aom_malloc(MAX_DATA_BLOCK * MAX_DATA_BLOCK *
                                  sizeof(*src_)));
    ASSERT_NE(src_, nullptr);
    dgd_ = (uint8_t *)(aom_malloc(MAX_DATA_BLOCK * MAX_DATA_BLOCK *
                                  sizeof(*dgd_)));
    ASSERT_NE(dgd_, nullptr);
    flt0_ = (int32_t *)(aom_malloc(MAX_DATA_BLOCK * MAX_DATA_BLOCK *
                                   sizeof(*flt0_)));
    ASSERT_NE(flt0_, nullptr);
    flt1_ = (int32_t *)(aom_malloc(MAX_DATA_BLOCK * MAX_DATA_BLOCK *
                                   sizeof(*flt1_)));
    ASSERT_NE(flt1_, nullptr);
  }